

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_GenFsm(char *pFileName,int nPis,int nPos,int nStates,int nLines,int ProbI,int ProbO)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Wrd_t *p;
  word *pwVar6;
  Vec_Str_t *vCond;
  char *pcVar7;
  FILE *__stream;
  ulong uVar8;
  undefined4 in_register_0000008c;
  ulong uVar9;
  uint uVar10;
  
  uVar2 = (ulong)(uint)nLines;
  uVar10 = nStates;
  if (1 < (uint)nStates) {
    uVar10 = 0;
    uVar3 = nStates - 1;
    if (uVar3 != 0) {
      do {
        uVar10 = uVar10 + 1;
        bVar1 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar1);
    }
  }
  Aig_ManRandom(1);
  p = (Vec_Wrd_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < nLines - 1U) {
    iVar4 = nLines;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  uVar9 = 0;
  if (iVar4 == 0) {
    pwVar6 = (word *)0x0;
  }
  else {
    pwVar6 = (word *)malloc((long)iVar4 << 3);
  }
  p->pArray = pwVar6;
  vCond = (Vec_Str_t *)malloc(0x10);
  vCond->nCap = 1000;
  vCond->nSize = 0;
  pcVar7 = (char *)malloc(1000);
  vCond->pArray = pcVar7;
  if (0 < nStates) {
    uVar9 = 0;
    do {
      do {
        uVar3 = Aig_ManRandom(0);
      } while (uVar9 == (ulong)uVar3 % (ulong)(uint)nStates);
      Vec_WrdPush(p,(ulong)uVar3 % (ulong)(uint)nStates | uVar9 << 0x20);
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uint)nStates);
  }
  if ((int)uVar9 < nLines) {
    do {
      do {
        uVar3 = Aig_ManRandom(0);
        uVar5 = Aig_ManRandom(0);
      } while (uVar5 % (uint)nStates == (uint)((ulong)uVar3 % (ulong)(uint)nStates));
      Vec_WrdPush(p,(long)(int)(uVar5 % (uint)nStates) | (ulong)uVar3 % (ulong)(uint)nStates << 0x20
                 );
      uVar3 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar3;
    } while (uVar3 != nLines);
  }
  pwVar6 = p->pArray;
  uVar3 = p->nSize;
  uVar9 = (ulong)uVar3;
  qsort(pwVar6,(long)(int)uVar3,8,Vec_WrdSortCompare1);
  __stream = fopen(pFileName,"w");
  pcVar7 = Extra_TimeStamp();
  fprintf(__stream,"# This random FSM was generated by ABC on %s\n",pcVar7);
  fprintf(__stream,"# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n",
          (ulong)(uint)nPis,(ulong)(uint)nPos,(ulong)(uint)nStates,uVar2,
          CONCAT44(in_register_0000008c,ProbI),(ulong)(uint)ProbO,pFileName);
  fprintf(__stream,"# FSM has %d inputs, %d outputs, %d states, and %d products\n",(ulong)(uint)nPis
          ,(ulong)(uint)nPos,(ulong)(uint)nStates,uVar2);
  fprintf(__stream,".i %d\n",(ulong)(uint)nPis);
  fprintf(__stream,".o %d\n",(ulong)(uint)nPos);
  fprintf(__stream,".p %d\n",uVar2);
  fprintf(__stream,".s %d\n",(ulong)(uint)nStates);
  if (0 < nLines) {
    if ((int)uVar3 < 1) {
      uVar9 = 0;
    }
    uVar8 = 0;
    do {
      Abc_GenFsmCond(vCond,nPis,ProbI);
      fprintf(__stream,"%s ",vCond->pArray);
      if (uVar9 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      fprintf(__stream,"%0*d ",(ulong)uVar10,(ulong)*(uint *)((long)pwVar6 + uVar8 * 8 + 4));
      fprintf(__stream,"%0*d ",(ulong)uVar10,(ulong)(uint)pwVar6[uVar8]);
      if (0 < nPos) {
        Abc_GenFsmCond(vCond,nPos,ProbO);
        fputs(vCond->pArray,__stream);
      }
      fputc(10,__stream);
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  fwrite(".e",2,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (pwVar6 != (word *)0x0) {
    free(pwVar6);
    p->pArray = (word *)0x0;
  }
  free(p);
  if (vCond->pArray != (char *)0x0) {
    free(vCond->pArray);
    vCond->pArray = (char *)0x0;
  }
  free(vCond);
  return;
}

Assistant:

void Abc_GenFsm( char * pFileName, int nPis, int nPos, int nStates, int nLines, int ProbI, int ProbO )
{
    FILE * pFile;
    Vec_Wrd_t * vStates;
    Vec_Str_t * vCond;
    int i, iState, iState2;
    int nDigits = Abc_Base10Log( nStates );
    Aig_ManRandom( 1 );
    vStates = Vec_WrdAlloc( nLines );
    vCond = Vec_StrAlloc( 1000 );
    for ( i = 0; i < nStates; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        if ( iState == i )
            continue;
        Vec_WrdPush( vStates, ((word)i << 32) | iState );
        i++;
    }
    for (      ; i < nLines; )
    {
        iState = Aig_ManRandom( 0 ) % nStates;
        iState2 = Aig_ManRandom( 0 ) % nStates;
        if ( iState2 == iState )
            continue;
        Vec_WrdPush( vStates, ((word)iState << 32) | iState2 );
        i++;
    }
    Vec_WrdSort( vStates, 0 );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# This random FSM was generated by ABC on %s\n", Extra_TimeStamp() );
    fprintf( pFile, "# Command line was: \"genfsm -I %d -O %d -S %d -L %d -P %d -Q %d %s\"\n", nPis, nPos, nStates, nLines, ProbI, ProbO, pFileName );
    fprintf( pFile, "# FSM has %d inputs, %d outputs, %d states, and %d products\n", nPis, nPos, nStates, nLines );
    fprintf( pFile, ".i %d\n", nPis );
    fprintf( pFile, ".o %d\n", nPos );
    fprintf( pFile, ".p %d\n", nLines );
    fprintf( pFile, ".s %d\n", nStates );
    for ( i = 0; i < nLines; i++ )
    {
        Abc_GenFsmCond( vCond, nPis, ProbI );
        fprintf( pFile, "%s ", Vec_StrArray(vCond) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i) >> 32) );
        fprintf( pFile, "%0*d ", nDigits, (int)(Vec_WrdEntry(vStates, i)) );
        if ( nPos > 0 )
        {
            Abc_GenFsmCond( vCond, nPos, ProbO );
            fprintf( pFile, "%s", Vec_StrArray(vCond) );
        }
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".e" );
    fprintf( pFile, "\n" );
    fclose( pFile );
    Vec_WrdFree( vStates );
    Vec_StrFree( vCond );
}